

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-group.c
# Opt level: O0

void monster_group_rouse(chunk *c,monster *mon)

{
  loc_conflict grid;
  _Bool _Var1;
  wchar_t wVar2;
  uint32_t uVar3;
  monster *mon_00;
  wchar_t dist;
  loc_conflict fgrid;
  monster *friend;
  mon_group_list_entry_conflict *entry;
  monster_group_conflict *group;
  wchar_t index;
  monster *mon_local;
  chunk *c_local;
  
  friend = (monster *)c->monster_groups[mon->group_info[0].index]->member_list;
  _Var1 = flag_has_dbg(mon->mflag,2,8,"mon->mflag","MFLAG_AWARE");
  if (_Var1) {
    for (; friend != (monster *)0x0; friend = (monster *)friend->original_race) {
      mon_00 = c->monsters + *(int *)&friend->race;
      grid.x = (mon_00->grid).x;
      grid.y = (mon_00->grid).y;
      if ((mon_00->m_timed[0] != 0) && (_Var1 = monster_can_see(c,mon,grid), _Var1)) {
        wVar2 = distance(mon->grid,(loc)grid);
        uVar3 = Rand_div(wVar2 * 0x14);
        if (uVar3 == 0) {
          monster_wake(mon_00,true,L'2');
        }
      }
    }
  }
  return;
}

Assistant:

void monster_group_rouse(struct chunk *c, struct monster *mon)
{
	int index = mon->group_info[PRIMARY_GROUP].index;
	struct monster_group *group = c->monster_groups[index];
	struct mon_group_list_entry *entry = group->member_list;

	/* Not aware means don't rouse */
	if (!mflag_has(mon->mflag, MFLAG_AWARE)) return;

	while (entry) {
		struct monster *friend = &c->monsters[entry->midx];
		struct loc fgrid = friend->grid;
		if (friend->m_timed[MON_TMD_SLEEP] && monster_can_see(c, mon, fgrid)) {
			int dist = distance(mon->grid, fgrid);

			/* Closer means more likely to be roused */
			if (one_in_(dist * 20)) {
				monster_wake(friend, true, 50);
			}
		}
		entry = entry->next;
	}
}